

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O3

void __thiscall boost::deflate::deflate_stream_test::run(deflate_stream_test *this)

{
  BoostCompressor *c;
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"sizeof(deflate_stream) == ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  testDeflate(this,(ICompressor *)this);
  c = &this->beast_compressor;
  testDeflate(this,&c->super_ICompressor);
  testInvalidSettings((ICompressor *)this);
  testInvalidSettings(&c->super_ICompressor);
  testWriteAfterFinish((ICompressor *)this);
  testWriteAfterFinish(&c->super_ICompressor);
  testFlushPartial((ICompressor *)this);
  testFlushPartial(&c->super_ICompressor);
  testFlushAtLiteralBufferFull((ICompressor *)this);
  testFlushAtLiteralBufferFull(&c->super_ICompressor);
  testRLEMatchLengthExceedLookahead((ICompressor *)this);
  testRLEMatchLengthExceedLookahead(&c->super_ICompressor);
  testFlushAfterDistMatch((ICompressor *)this);
  testFlushAfterDistMatch(&c->super_ICompressor);
  testWrappedStream();
  return;
}

Assistant:

void
    run()
    {
        std::cerr <<
            "sizeof(deflate_stream) == " <<
            sizeof(deflate_stream) << std::endl;

        testDeflate(zlib_compressor);
        testDeflate(beast_compressor);
        testInvalidSettings(zlib_compressor);
        testInvalidSettings(beast_compressor);
        testWriteAfterFinish(zlib_compressor);
        testWriteAfterFinish(beast_compressor);
        testFlushPartial(zlib_compressor);
        testFlushPartial(beast_compressor);
        testFlushAtLiteralBufferFull(zlib_compressor);
        testFlushAtLiteralBufferFull(beast_compressor);
        testRLEMatchLengthExceedLookahead(zlib_compressor);
        testRLEMatchLengthExceedLookahead(beast_compressor);
        testFlushAfterDistMatch(zlib_compressor);
        testFlushAfterDistMatch(beast_compressor);
        testWrappedStream();
    }